

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall cmCTestBuildHandler::GenerateXMLHeader(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  cmXMLWriter *pcVar1;
  string local_e8;
  allocator local_c1;
  string local_c0;
  uint local_a0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  cmCTestBuildHandler *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,xml,
                    (bool)((this->super_cmCTestGenericHandler).AppendXML & 1));
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Build",&local_39);
  cmXMLWriter::StartElement(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"StartDateTime",&local_71);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_70,&this->StartBuild);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"StartBuildTime",&local_99);
  local_a0 = (uint)(long)this->StartBuildTime;
  cmXMLWriter::Element<unsigned_int>(pcVar1,&local_98,&local_a0);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"BuildCommand",&local_c1);
  GetMakeCommand_abi_cxx11_(&local_e8,this);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_c0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLHeader(cmXMLWriter& xml)
{
  this->CTest->StartXML(xml, this->AppendXML);
  xml.StartElement("Build");
  xml.Element("StartDateTime", this->StartBuild);
  xml.Element("StartBuildTime",
    static_cast<unsigned int>(this->StartBuildTime));
  xml.Element("BuildCommand", this->GetMakeCommand());
}